

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable_unittests.cc
# Opt level: O0

void __thiscall
HashtableAllTest_LoadFactor_Test<google::HashtableInterface_SparseHashSet<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
::TestBody(HashtableAllTest_LoadFactor_Test<google::HashtableInterface_SparseHashSet<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
           *this)

{
  bool bVar1;
  size_type sVar2;
  AssertionResult gtest_ar_7;
  AssertionResult gtest_ar_6;
  int i_1;
  AssertionResult gtest_ar_5;
  AssertionResult gtest_ar_4;
  float shrink_threshold;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  int i;
  size_t bucket_count;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  TypeParam ht;
  float grow_threshold;
  size_type kSize;
  key_type *in_stack_fffffffffffffb08;
  HashtableTest<google::HashtableInterface_SparseHashSet<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffffb10;
  key_equal *in_stack_fffffffffffffb18;
  HashtableTest<google::HashtableInterface_SparseHashSet<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffffb20;
  undefined4 in_stack_fffffffffffffb28;
  float in_stack_fffffffffffffb2c;
  float in_stack_fffffffffffffb30;
  float in_stack_fffffffffffffb34;
  float in_stack_fffffffffffffb3c;
  float type;
  AssertHelper *in_stack_fffffffffffffb40;
  float in_stack_fffffffffffffb88;
  float in_stack_fffffffffffffb8c;
  AssertHelper *in_stack_fffffffffffffb90;
  float local_464;
  float local_42c;
  float local_424;
  Hasher *this_00;
  BaseHashtableInterface<google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  *this_01;
  AssertionResult local_388 [2];
  HashtableTest<google::HashtableInterface_SparseHashSet<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  *local_368;
  AssertionResult local_360 [6];
  value_type local_2f8;
  key_type local_2f0;
  key_type local_2e8;
  int local_2dc;
  float local_2c4;
  AssertionResult local_2c0 [2];
  float local_29c;
  undefined8 local_298;
  AssertionResult local_290;
  float local_27c;
  size_type local_268;
  AssertionResult local_260 [2];
  size_type local_240;
  AssertionResult local_238 [6];
  value_type local_1d0;
  int local_1c4;
  key_type local_1c0;
  value_type local_160;
  size_type local_158;
  float local_13c;
  undefined8 local_138;
  AssertionResult local_130 [2];
  float local_10c;
  AssertionResult local_108;
  key_type local_f8;
  undefined1 local_e0 [204];
  float local_14;
  undefined8 local_10;
  
  local_10 = 0x4098;
  for (local_14 = 0.2; local_14 <= 0.8; local_14 = local_14 + 0.2) {
    Hasher::Hasher((Hasher *)(local_e0 + 0x1c),0);
    this_00 = (Hasher *)(local_e0 + 0x10);
    Hasher::Hasher(this_00,0);
    this_01 = (BaseHashtableInterface<google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
               *)local_e0;
    Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>::Alloc
              ((Alloc<const_char_*,_unsigned_long,_18446744073709551615UL> *)this_01,0,(int *)0x0);
    google::
    HashtableInterface_SparseHashSet<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
    ::HashtableInterface_SparseHashSet
              ((HashtableInterface_SparseHashSet<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
                *)CONCAT44(in_stack_fffffffffffffb34,in_stack_fffffffffffffb30),
               CONCAT44(in_stack_fffffffffffffb2c,in_stack_fffffffffffffb28),
               (hasher *)in_stack_fffffffffffffb20,in_stack_fffffffffffffb18,
               (allocator_type *)in_stack_fffffffffffffb10);
    Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>::~Alloc
              ((Alloc<const_char_*,_unsigned_long,_18446744073709551615UL> *)local_e0);
    local_f8 = HashtableTest<google::HashtableInterface_SparseHashSet<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
               ::UniqueKey(in_stack_fffffffffffffb20,(int)((ulong)in_stack_fffffffffffffb18 >> 0x20)
                          );
    google::
    BaseHashtableInterface<google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
    ::set_deleted_key((BaseHashtableInterface<google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                       *)in_stack_fffffffffffffb10,in_stack_fffffffffffffb08);
    google::
    BaseHashtableInterface<google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
    ::max_load_factor((BaseHashtableInterface<google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                       *)in_stack_fffffffffffffb10,(float)((ulong)in_stack_fffffffffffffb08 >> 0x20)
                     );
    google::
    BaseHashtableInterface<google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
    ::min_load_factor((BaseHashtableInterface<google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                       *)in_stack_fffffffffffffb10,(float)((ulong)in_stack_fffffffffffffb08 >> 0x20)
                     );
    local_10c = google::
                BaseHashtableInterface<google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                ::max_load_factor((BaseHashtableInterface<google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                                   *)0xcc3d38);
    testing::internal::EqHelper::Compare<float,_float,_nullptr>
              ((char *)CONCAT44(in_stack_fffffffffffffb2c,in_stack_fffffffffffffb28),
               (char *)in_stack_fffffffffffffb20,(float *)in_stack_fffffffffffffb18,
               (float *)in_stack_fffffffffffffb10);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_108);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffffb40);
      testing::AssertionResult::failure_message((AssertionResult *)0xcc3df5);
      testing::internal::AssertHelper::AssertHelper
                (in_stack_fffffffffffffb40,(Type)in_stack_fffffffffffffb3c,
                 (char *)CONCAT44(in_stack_fffffffffffffb34,in_stack_fffffffffffffb30),
                 (int)in_stack_fffffffffffffb2c,(char *)in_stack_fffffffffffffb20);
      testing::internal::AssertHelper::operator=
                (in_stack_fffffffffffffb90,
                 (Message *)CONCAT44(in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88));
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffb10);
      testing::Message::~Message((Message *)0xcc3e58);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xcc3ec9);
    local_138 = 0;
    local_13c = google::
                BaseHashtableInterface<google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                ::min_load_factor((BaseHashtableInterface<google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                                   *)0xcc3ee2);
    testing::internal::EqHelper::Compare<double,_float,_nullptr>
              ((char *)CONCAT44(in_stack_fffffffffffffb2c,in_stack_fffffffffffffb28),
               (char *)in_stack_fffffffffffffb20,(double *)in_stack_fffffffffffffb18,
               (float *)in_stack_fffffffffffffb10);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(local_130);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffffb40);
      testing::AssertionResult::failure_message((AssertionResult *)0xcc3f72);
      testing::internal::AssertHelper::AssertHelper
                (in_stack_fffffffffffffb40,(Type)in_stack_fffffffffffffb3c,
                 (char *)CONCAT44(in_stack_fffffffffffffb34,in_stack_fffffffffffffb30),
                 (int)in_stack_fffffffffffffb2c,(char *)in_stack_fffffffffffffb20);
      testing::internal::AssertHelper::operator=
                (in_stack_fffffffffffffb90,
                 (Message *)CONCAT44(in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88));
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffb10);
      testing::Message::~Message((Message *)0xcc3fd5);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xcc4046);
    google::
    BaseHashtableInterface<google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
    ::resize((BaseHashtableInterface<google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              *)in_stack_fffffffffffffb10,(size_type)in_stack_fffffffffffffb08);
    local_158 = google::
                BaseHashtableInterface<google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                ::bucket_count((BaseHashtableInterface<google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                                *)0xcc4067);
    local_160 = HashtableTest<google::HashtableInterface_SparseHashSet<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                ::UniqueObject(in_stack_fffffffffffffb10,
                               (int)((ulong)in_stack_fffffffffffffb08 >> 0x20));
    google::
    BaseHashtableInterface<google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
    ::insert(this_01,(value_type *)this_00);
    local_1c0 = HashtableTest<google::HashtableInterface_SparseHashSet<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                ::UniqueKey(in_stack_fffffffffffffb20,
                            (int)((ulong)in_stack_fffffffffffffb18 >> 0x20));
    google::
    BaseHashtableInterface<google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
    ::erase((BaseHashtableInterface<google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
             *)in_stack_fffffffffffffb10,in_stack_fffffffffffffb08);
    local_1c4 = 2;
    while( true ) {
      local_1d0 = HashtableTest<google::HashtableInterface_SparseHashSet<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                  ::UniqueObject(in_stack_fffffffffffffb10,
                                 (int)((ulong)in_stack_fffffffffffffb08 >> 0x20));
      google::
      BaseHashtableInterface<google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
      ::insert(this_01,(value_type *)this_00);
      sVar2 = google::
              BaseHashtableInterface<google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              ::size((BaseHashtableInterface<google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                      *)0xcc4174);
      local_424 = (float)sVar2;
      local_42c = (float)local_158;
      if (local_14 <= local_424 / local_42c) break;
      local_240 = google::
                  BaseHashtableInterface<google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                  ::bucket_count((BaseHashtableInterface<google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                                  *)0xcc425f);
      testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
                ((char *)CONCAT44(in_stack_fffffffffffffb2c,in_stack_fffffffffffffb28),
                 (char *)in_stack_fffffffffffffb20,(unsigned_long *)in_stack_fffffffffffffb18,
                 (unsigned_long *)in_stack_fffffffffffffb10);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(local_238);
      if (!bVar1) {
        testing::Message::Message((Message *)in_stack_fffffffffffffb40);
        testing::AssertionResult::failure_message((AssertionResult *)0xcc42ec);
        testing::internal::AssertHelper::AssertHelper
                  (in_stack_fffffffffffffb40,(Type)in_stack_fffffffffffffb3c,
                   (char *)CONCAT44(in_stack_fffffffffffffb34,in_stack_fffffffffffffb30),
                   (int)in_stack_fffffffffffffb2c,(char *)in_stack_fffffffffffffb20);
        testing::internal::AssertHelper::operator=
                  (in_stack_fffffffffffffb90,
                   (Message *)CONCAT44(in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88));
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffb10);
        testing::Message::~Message((Message *)0xcc434f);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0xcc43ba);
      local_1c4 = local_1c4 + 1;
    }
    local_268 = google::
                BaseHashtableInterface<google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                ::bucket_count((BaseHashtableInterface<google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                                *)0xcc43de);
    testing::internal::CmpHelperGT<unsigned_long,unsigned_long>
              ((char *)CONCAT44(in_stack_fffffffffffffb2c,in_stack_fffffffffffffb28),
               (char *)in_stack_fffffffffffffb20,(unsigned_long *)in_stack_fffffffffffffb18,
               (unsigned_long *)in_stack_fffffffffffffb10);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(local_260);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffffb40);
      testing::AssertionResult::failure_message((AssertionResult *)0xcc4459);
      testing::internal::AssertHelper::AssertHelper
                (in_stack_fffffffffffffb40,(Type)in_stack_fffffffffffffb3c,
                 (char *)CONCAT44(in_stack_fffffffffffffb34,in_stack_fffffffffffffb30),
                 (int)in_stack_fffffffffffffb2c,(char *)in_stack_fffffffffffffb20);
      testing::internal::AssertHelper::operator=
                (in_stack_fffffffffffffb90,
                 (Message *)CONCAT44(in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88));
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffb10);
      testing::Message::~Message((Message *)0xcc44bc);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xcc4527);
    sVar2 = google::
            BaseHashtableInterface<google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
            ::size((BaseHashtableInterface<google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                    *)0xcc4560);
    local_464 = (float)sVar2;
    in_stack_fffffffffffffb90 =
         (AssertHelper *)
         google::
         BaseHashtableInterface<google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
         ::bucket_count((BaseHashtableInterface<google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                         *)0xcc45d6);
    in_stack_fffffffffffffb88 = (float)in_stack_fffffffffffffb90;
    local_27c = local_464 / in_stack_fffffffffffffb88 + -0.01;
    google::
    BaseHashtableInterface<google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
    ::set_resizing_parameters
              ((BaseHashtableInterface<google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                *)in_stack_fffffffffffffb10,(float)((ulong)in_stack_fffffffffffffb08 >> 0x20),
               SUB84(in_stack_fffffffffffffb08,0));
    local_298 = 0x3ff0000000000000;
    local_29c = google::
                BaseHashtableInterface<google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                ::max_load_factor((BaseHashtableInterface<google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                                   *)0xcc4691);
    testing::internal::EqHelper::Compare<double,_float,_nullptr>
              ((char *)CONCAT44(in_stack_fffffffffffffb2c,in_stack_fffffffffffffb28),
               (char *)in_stack_fffffffffffffb20,(double *)in_stack_fffffffffffffb18,
               (float *)in_stack_fffffffffffffb10);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_290);
    in_stack_fffffffffffffb8c = local_464;
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffffb40);
      testing::AssertionResult::failure_message((AssertionResult *)0xcc4709);
      testing::internal::AssertHelper::AssertHelper
                (in_stack_fffffffffffffb40,(Type)in_stack_fffffffffffffb3c,
                 (char *)CONCAT44(in_stack_fffffffffffffb34,in_stack_fffffffffffffb30),
                 (int)in_stack_fffffffffffffb2c,(char *)in_stack_fffffffffffffb20);
      testing::internal::AssertHelper::operator=
                (in_stack_fffffffffffffb90,(Message *)CONCAT44(local_464,in_stack_fffffffffffffb88))
      ;
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffb10);
      testing::Message::~Message((Message *)0xcc4766);
      in_stack_fffffffffffffb8c = local_464;
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xcc47d4);
    local_2c4 = google::
                BaseHashtableInterface<google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                ::min_load_factor((BaseHashtableInterface<google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                                   *)0xcc47e1);
    testing::internal::EqHelper::Compare<float,_float,_nullptr>
              ((char *)CONCAT44(in_stack_fffffffffffffb2c,in_stack_fffffffffffffb28),
               (char *)in_stack_fffffffffffffb20,(float *)in_stack_fffffffffffffb18,
               (float *)in_stack_fffffffffffffb10);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(local_2c0);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffffb40);
      testing::AssertionResult::failure_message((AssertionResult *)0xcc486b);
      testing::internal::AssertHelper::AssertHelper
                (in_stack_fffffffffffffb40,(Type)in_stack_fffffffffffffb3c,
                 (char *)CONCAT44(in_stack_fffffffffffffb34,in_stack_fffffffffffffb30),
                 (int)in_stack_fffffffffffffb2c,(char *)in_stack_fffffffffffffb20);
      testing::internal::AssertHelper::operator=
                (in_stack_fffffffffffffb90,
                 (Message *)CONCAT44(in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88));
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffb10);
      testing::Message::~Message((Message *)0xcc48c8);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xcc4939);
    local_158 = google::
                BaseHashtableInterface<google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                ::bucket_count((BaseHashtableInterface<google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                                *)0xcc4946);
    local_2dc = 2;
    while( true ) {
      local_2e8 = HashtableTest<google::HashtableInterface_SparseHashSet<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                  ::UniqueKey(in_stack_fffffffffffffb20,
                              (int)((ulong)in_stack_fffffffffffffb18 >> 0x20));
      google::
      BaseHashtableInterface<google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
      ::erase((BaseHashtableInterface<google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
               *)in_stack_fffffffffffffb10,in_stack_fffffffffffffb08);
      local_2f0 = HashtableTest<google::HashtableInterface_SparseHashSet<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                  ::UniqueKey(in_stack_fffffffffffffb20,
                              (int)((ulong)in_stack_fffffffffffffb18 >> 0x20));
      google::
      BaseHashtableInterface<google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
      ::erase((BaseHashtableInterface<google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
               *)in_stack_fffffffffffffb10,in_stack_fffffffffffffb08);
      local_2f8 = HashtableTest<google::HashtableInterface_SparseHashSet<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                  ::UniqueObject(in_stack_fffffffffffffb10,
                                 (int)((ulong)in_stack_fffffffffffffb08 >> 0x20));
      google::
      BaseHashtableInterface<google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
      ::insert(this_01,(value_type *)this_00);
      in_stack_fffffffffffffb40 =
           (AssertHelper *)
           google::
           BaseHashtableInterface<google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
           ::size((BaseHashtableInterface<google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                   *)0xcc4a3b);
      in_stack_fffffffffffffb2c = (float)in_stack_fffffffffffffb40;
      in_stack_fffffffffffffb30 = (float)(long)local_158;
      in_stack_fffffffffffffb34 = (float)local_158;
      if (in_stack_fffffffffffffb2c / in_stack_fffffffffffffb34 <= local_27c) break;
      type = in_stack_fffffffffffffb2c;
      in_stack_fffffffffffffb20 =
           (HashtableTest<google::HashtableInterface_SparseHashSet<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
            *)google::
              BaseHashtableInterface<google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              ::bucket_count((BaseHashtableInterface<google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                              *)0xcc4af8);
      local_368 = in_stack_fffffffffffffb20;
      testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
                ((char *)CONCAT44(in_stack_fffffffffffffb2c,in_stack_fffffffffffffb28),
                 (char *)in_stack_fffffffffffffb20,(unsigned_long *)in_stack_fffffffffffffb18,
                 (unsigned_long *)in_stack_fffffffffffffb10);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(local_360);
      if (!bVar1) {
        testing::Message::Message((Message *)in_stack_fffffffffffffb40);
        in_stack_fffffffffffffb18 =
             (key_equal *)testing::AssertionResult::failure_message((AssertionResult *)0xcc4b7f);
        testing::internal::AssertHelper::AssertHelper
                  (in_stack_fffffffffffffb40,(Type)type,
                   (char *)CONCAT44(in_stack_fffffffffffffb34,in_stack_fffffffffffffb30),
                   (int)in_stack_fffffffffffffb2c,(char *)in_stack_fffffffffffffb20);
        testing::internal::AssertHelper::operator=
                  (in_stack_fffffffffffffb90,
                   (Message *)CONCAT44(in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88));
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffb10);
        testing::Message::~Message((Message *)0xcc4bdc);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0xcc4c47);
      local_2dc = local_2dc + 1;
    }
    in_stack_fffffffffffffb3c = in_stack_fffffffffffffb2c;
    in_stack_fffffffffffffb10 =
         (HashtableTest<google::HashtableInterface_SparseHashSet<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
          *)google::
            BaseHashtableInterface<google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
            ::bucket_count((BaseHashtableInterface<google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                            *)0xcc4c6b);
    testing::internal::CmpHelperLT<unsigned_long,unsigned_long>
              ((char *)CONCAT44(in_stack_fffffffffffffb2c,in_stack_fffffffffffffb28),
               (char *)in_stack_fffffffffffffb20,(unsigned_long *)in_stack_fffffffffffffb18,
               (unsigned_long *)in_stack_fffffffffffffb10);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(local_388);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffffb40);
      in_stack_fffffffffffffb08 =
           (key_type *)testing::AssertionResult::failure_message((AssertionResult *)0xcc4ce0);
      testing::internal::AssertHelper::AssertHelper
                (in_stack_fffffffffffffb40,(Type)in_stack_fffffffffffffb3c,
                 (char *)CONCAT44(in_stack_fffffffffffffb34,in_stack_fffffffffffffb30),
                 (int)in_stack_fffffffffffffb2c,(char *)in_stack_fffffffffffffb20);
      testing::internal::AssertHelper::operator=
                (in_stack_fffffffffffffb90,
                 (Message *)CONCAT44(in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88));
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffb10);
      testing::Message::~Message((Message *)0xcc4d3b);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xcc4da6);
    google::
    HashtableInterface_SparseHashSet<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
    ::~HashtableInterface_SparseHashSet
              ((HashtableInterface_SparseHashSet<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
                *)0xcc4ddc);
  }
  return;
}

Assistant:

TYPED_TEST(HashtableAllTest, LoadFactor) {
  const typename TypeParam::size_type kSize = 16536;
  // Check growing past various thresholds and then shrinking below
  // them.
  for (float grow_threshold = 0.2f; grow_threshold <= 0.8f;
       grow_threshold += 0.2f) {
    TypeParam ht;
    ht.set_deleted_key(this->UniqueKey(1));
    ht.max_load_factor(grow_threshold);
    ht.min_load_factor(0.0);
    EXPECT_EQ(grow_threshold, ht.max_load_factor());
    EXPECT_EQ(0.0, ht.min_load_factor());

    ht.resize(kSize);
    size_t bucket_count = ht.bucket_count();
    // Erase and insert an element to set consider_shrink = true,
    // which should not cause a shrink because the threshold is 0.0.
    ht.insert(this->UniqueObject(2));
    ht.erase(this->UniqueKey(2));
    for (int i = 2;; ++i) {
      ht.insert(this->UniqueObject(i));
      if (static_cast<float>(ht.size()) / bucket_count < grow_threshold) {
        EXPECT_EQ(bucket_count, ht.bucket_count());
      } else {
        EXPECT_GT(ht.bucket_count(), bucket_count);
        break;
      }
    }
    // Now set a shrink threshold 1% below the current size and remove
    // items until the size falls below that.
    const float shrink_threshold =
        static_cast<float>(ht.size()) / ht.bucket_count() - 0.01f;

    // This time around, check the old set_resizing_parameters interface.
    ht.set_resizing_parameters(shrink_threshold, 1.0);
    EXPECT_EQ(1.0, ht.max_load_factor());
    EXPECT_EQ(shrink_threshold, ht.min_load_factor());

    bucket_count = ht.bucket_count();
    for (int i = 2;; ++i) {
      ht.erase(this->UniqueKey(i));
      // A resize is only triggered by an insert, so add and remove a
      // value every iteration to trigger the shrink as soon as the
      // threshold is passed.
      ht.erase(this->UniqueKey(i + 1));
      ht.insert(this->UniqueObject(i + 1));
      if (static_cast<float>(ht.size()) / bucket_count > shrink_threshold) {
        EXPECT_EQ(bucket_count, ht.bucket_count());
      } else {
        EXPECT_LT(ht.bucket_count(), bucket_count);
        break;
      }
    }
  }
}